

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::typeToStr_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this,Type t)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(t) {
  case Integer:
    pcVar2 = "int";
    paVar1 = &local_9;
    break;
  case Double:
    pcVar2 = "double";
    paVar1 = &local_a;
    break;
  case Short:
    pcVar2 = "short";
    paVar1 = &local_b;
    break;
  case U_Integer:
    pcVar2 = "size_t";
    paVar1 = &local_c;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"This type does not exist \n");
    exit(1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::typeToStr(Type t)
{
    switch(t)
    {
    case Type::Integer : return "int";
    case Type::Double : return "double";            
    case Type::Short : return "short";
    case Type::U_Integer : return "size_t";
    default :
        ERROR("This type does not exist \n");
        exit(1);
    }
}